

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

word Dau_Dsd6ToTruth_rec(char *pStr,char **p,int *pMatches,word *pTruths)

{
  char cVar1;
  char cVar2;
  int nVars;
  word wVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  int iVar9;
  char *pcVar10;
  long lVar11;
  char *pcVar12;
  word Temp [3];
  word Fanins [6];
  
  pcVar10 = *p;
  cVar1 = *pcVar10;
  if (cVar1 == '!') {
    *p = pcVar10 + 1;
    pcVar12 = pcVar10 + 1;
    bVar5 = *pcVar12 + 0x9f;
    pcVar10 = pcVar10 + 1;
    cVar2 = *pcVar12;
    if (bVar5 < 6) {
      return ~pTruths[bVar5];
    }
  }
  else {
    cVar2 = cVar1;
    if ((byte)(cVar1 + 0x9fU) < 6) {
      return pTruths[(byte)(cVar1 + 0x9fU)];
    }
  }
  if (cVar2 == '[') {
    iVar9 = pMatches[(long)pcVar10 - (long)pStr];
    if (pStr[iVar9] != ']') {
      __assert_fail("**p == \'[\' && *q == \']\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0x179,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
    }
    uVar6 = 0;
    while( true ) {
      pcVar10 = pcVar10 + 1;
      *p = pcVar10;
      if (pStr + iVar9 <= pcVar10) break;
      wVar3 = Dau_Dsd6ToTruth_rec(pStr,p,pMatches,pTruths);
      uVar6 = uVar6 ^ wVar3;
      pcVar10 = *p;
    }
    if (pcVar10 != pStr + iVar9) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0x17c,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
    }
  }
  else {
    if (cVar2 == '<') {
      lVar8 = (long)pMatches[(long)pcVar10 - (long)pStr];
      lVar11 = 0;
      if (pStr[lVar8 + 1] == '{') {
        pcVar12 = pStr + lVar8 + 1;
        *p = pcVar12;
        if ((*pcVar12 != '{') ||
           (pcVar12 = pStr + pMatches[(long)pcVar12 - (long)pStr], *pcVar12 != '}')) {
          __assert_fail("**p == \'{\' && *q2 == \'}\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                        ,0x18c,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
        }
        pcVar7 = pStr + lVar8 + 2;
        *p = pcVar7;
        lVar11 = 0;
        while (pcVar7 < pcVar12) {
          wVar3 = Dau_Dsd6ToTruth_rec(pStr,p,pMatches,pTruths);
          Fanins[lVar11] = wVar3;
          pcVar7 = *p + 1;
          *p = pcVar7;
          lVar11 = lVar11 + 1;
        }
        if (pcVar7 != pcVar12) {
          __assert_fail("*p == q2",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                        ,399,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
        }
        lVar8 = (long)pMatches[(long)pcVar10 - (long)pStr];
        pTruths = Fanins;
      }
      *p = pcVar10;
      if ((*pcVar10 != '<') || (pcVar12 = pStr + lVar8, *pcVar12 != '>')) {
        __assert_fail("**p == \'<\' && *q == \'>\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                      ,0x197,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
      }
      pcVar7 = pcVar10;
      if ((uint)lVar11 != 0) {
        while (pcVar7 < pcVar12) {
          cVar2 = *pcVar7;
          pcVar7 = pcVar7 + 1;
          if ((uint)lVar11 <= (uint)(byte)(cVar2 + 0x9fU) && (byte)(cVar2 + 0x9fU) < 0x1a) {
            __assert_fail("*pOld - \'a\' < nVars",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                          ,0x19c,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
          }
        }
      }
      lVar8 = 0;
      while( true ) {
        pcVar7 = pcVar10 + 1;
        *p = pcVar7;
        if (pcVar12 <= pcVar7) break;
        wVar3 = Dau_Dsd6ToTruth_rec(pStr,p,pMatches,pTruths);
        *(word *)((long)Temp + lVar8) = wVar3;
        lVar8 = lVar8 + 8;
        pcVar10 = *p;
      }
      if (lVar8 == 0x18) {
        if (pcVar7 != pcVar12) {
          __assert_fail("*p == q",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                        ,0x1a1,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
        }
        if (pcVar12[1] == '{') {
          *p = pcVar10 + 2;
          if ((pcVar10[2] != '{') || (pStr[pMatches[(long)(pcVar10 + 2) - (long)pStr]] != '}')) {
            __assert_fail("**p == \'{\' && *q == \'}\'",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                          ,0x1a5,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
          }
          *p = pStr + pMatches[(long)(pcVar10 + 2) - (long)pStr];
        }
        return -(ulong)(cVar1 == '!') ^ Temp[2] ^ (Temp[1] ^ Temp[2]) & Temp[0];
      }
      __assert_fail("pTemp == Temp + 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0x1a0,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
    }
    if (cVar2 != '(') {
      if (5 < (byte)(cVar2 + 0xbfU) && 9 < (byte)(cVar2 - 0x30U)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                      ,0x1ba,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
      }
      nVars = Abc_TtReadHex(Temp,pcVar10);
      iVar9 = 1 << ((char)nVars - 2U & 0x1f);
      if (nVars < 3) {
        iVar9 = 1;
      }
      pcVar12 = *p;
      pcVar10 = pcVar12 + iVar9;
      *p = pcVar10;
      if ((pcVar12[iVar9] != '{') ||
         (pcVar12 = pStr + pMatches[(long)pcVar10 - (long)pStr], *pcVar12 != '}')) {
        __assert_fail("**p == \'{\' && *q == \'}\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                      ,0x1b2,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
      }
      pcVar10 = pcVar10 + 1;
      *p = pcVar10;
      lVar8 = 0;
      while (pcVar10 < pcVar12) {
        wVar3 = Dau_Dsd6ToTruth_rec(pStr,p,pMatches,pTruths);
        Fanins[lVar8] = wVar3;
        pcVar10 = *p + 1;
        *p = pcVar10;
        lVar8 = lVar8 + 1;
      }
      if (nVars != (int)lVar8) {
        __assert_fail("i == nVars",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                      ,0x1b5,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
      }
      if (pcVar10 != pcVar12) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                      ,0x1b6,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
      }
      uVar4 = Dau_Dsd6TruthCompose_rec(Temp[0],Fanins,nVars);
      uVar6 = -(ulong)(cVar1 == '!');
      goto LAB_00408630;
    }
    iVar9 = pMatches[(long)pcVar10 - (long)pStr];
    if (pStr[iVar9] != ')') {
      __assert_fail("**p == \'(\' && *q == \')\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0x16f,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
    }
    uVar6 = 0xffffffffffffffff;
    while( true ) {
      pcVar10 = pcVar10 + 1;
      *p = pcVar10;
      if (pStr + iVar9 <= pcVar10) break;
      wVar3 = Dau_Dsd6ToTruth_rec(pStr,p,pMatches,pTruths);
      uVar6 = uVar6 & wVar3;
      pcVar10 = *p;
    }
    if (pcVar10 != pStr + iVar9) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0x172,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
    }
  }
  uVar4 = -(ulong)(cVar1 == '!');
LAB_00408630:
  return uVar6 ^ uVar4;
}

Assistant:

word Dau_Dsd6ToTruth_rec( char * pStr, char ** p, int * pMatches, word * pTruths )
{
    int fCompl = 0;
    if ( **p == '!' )
        (*p)++, fCompl = 1;
    if ( **p >= 'a' && **p <= 'f' ) // var
    {
        assert( **p - 'a' >= 0 && **p - 'a' < 6 );
        return fCompl ? ~pTruths[**p - 'a'] : pTruths[**p - 'a'];
    }
    if ( **p == '(' ) // and/or
    {
        char * q = pStr + pMatches[ *p - pStr ];
        word Res = ~(word)0;
        assert( **p == '(' && *q == ')' );
        for ( (*p)++; *p < q; (*p)++ )
            Res &= Dau_Dsd6ToTruth_rec( pStr, p, pMatches, pTruths );
        assert( *p == q );
        return fCompl ? ~Res : Res;
    }
    if ( **p == '[' ) // xor
    {
        char * q = pStr + pMatches[ *p - pStr ];
        word Res = 0;
        assert( **p == '[' && *q == ']' );
        for ( (*p)++; *p < q; (*p)++ )
            Res ^= Dau_Dsd6ToTruth_rec( pStr, p, pMatches, pTruths );
        assert( *p == q );
        return fCompl ? ~Res : Res;
    }
    if ( **p == '<' ) // mux
    {
        int nVars = 0;
        word Temp[3], * pTemp = Temp, Res;
        word Fanins[6], * pTruths2;
        char * pOld = *p;
        char * q = pStr + pMatches[ *p - pStr ];
        // read fanins
        if ( *(q+1) == '{' )
        {
            char * q2;
            *p = q+1;
            q2 = pStr + pMatches[ *p - pStr ];
            assert( **p == '{' && *q2 == '}' );
            for ( nVars = 0, (*p)++; *p < q2; (*p)++, nVars++ )
                Fanins[nVars] = Dau_Dsd6ToTruth_rec( pStr, p, pMatches, pTruths );
            assert( *p == q2 );
            pTruths2 = Fanins;
        }
        else
            pTruths2 = pTruths;
        // read MUX
        *p = pOld;
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '<' && *q == '>' );
        // verify internal variables
        if ( nVars )
            for ( ; pOld < q; pOld++ )
                if ( *pOld >= 'a' && *pOld <= 'z' )
                    assert( *pOld - 'a' < nVars );
        // derive MAX components
        for ( (*p)++; *p < q; (*p)++ )
            *pTemp++ = Dau_Dsd6ToTruth_rec( pStr, p, pMatches, pTruths2 );
        assert( pTemp == Temp + 3 );
        assert( *p == q );
        if ( *(q+1) == '{' ) // and/or
        {
            char * q = pStr + pMatches[ ++(*p) - pStr ];
            assert( **p == '{' && *q == '}' );
            *p = q;
        }
        Res = (Temp[0] & Temp[1]) | (~Temp[0] & Temp[2]);
        return fCompl ? ~Res : Res;
    }
    if ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
    {
        word Func, Fanins[6], Res;
        char * q;
        int i, nVars = Abc_TtReadHex( &Func, *p );
        *p += Abc_TtHexDigitNum( nVars );
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '{' && *q == '}' );
        for ( i = 0, (*p)++; *p < q; (*p)++, i++ )
            Fanins[i] = Dau_Dsd6ToTruth_rec( pStr, p, pMatches, pTruths );
        assert( i == nVars );
        assert( *p == q );
        Res = Dau_Dsd6TruthCompose_rec( Func, Fanins, nVars );
        return fCompl ? ~Res : Res;
    }
    assert( 0 );
    return 0;
}